

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase *
EvaluateFunctionContextAccess(ExpressionEvalContext *ctx,ExprFunctionContextAccess *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  _func_int **pp_Var5;
  int iVar6;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar7 = (ExprBase *)0x0;
      target = FindVariableStorage(ctx,expression->contextVariable,false);
      if (target != (ExprPointerLiteral *)0x0) {
        pTVar4 = expression->function->contextType;
        if ((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0x12)) {
          __assert_fail("refType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x766,
                        "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                       );
        }
        pp_Var5 = pTVar4[1]._vptr_TypeBase;
        if ((pp_Var5 != (_func_int **)0x0) && (*(int *)(pp_Var5 + 1) == 0x18)) {
          if (pp_Var5[0xd] == (_func_int *)0x0) {
            pAVar2 = ctx->ctx->allocator;
            iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
            pSVar3 = (expression->super_ExprBase).source;
            pTVar4 = expression->function->contextType;
            pEVar7->typeID = 9;
            pEVar7->source = pSVar3;
            pEVar7->type = pTVar4;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
          }
          else {
            pEVar7 = CreateLoad(ctx,&target->super_ExprBase);
            if (pEVar7 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
          }
          pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
          return pEVar7;
        }
        __assert_fail("classType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x76a,
                      "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                     );
      }
    }
    else {
      pEVar7 = (ExprBase *)0x0;
      Report(ctx,"ERROR: instruction limit reached");
    }
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar3;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
  }
  return pEVar7;
}

Assistant:

ExprBase* EvaluateFunctionContextAccess(ExpressionEvalContext &ctx, ExprFunctionContextAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->contextVariable, false);

	if(!ptr)
		return NULL;

	ExprBase *value = NULL;

	TypeRef *refType = getType<TypeRef>(expression->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	if(classType->members.empty())
		value = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->function->contextType);
	else
		value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}